

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wapiti_wrap.cxx
# Opt level: O1

void Java_fr_limsi_wapiti_WapitiJNI_opt_1s_1prec_1set
               (JNIEnv *jenv,jclass jcls,jlong jarg1,jobject jarg1_,jint jarg2)

{
  if (jarg1 != 0) {
    *(jint *)(jarg1 + 0xe4) = jarg2;
  }
  return;
}

Assistant:

SWIGEXPORT void JNICALL Java_fr_limsi_wapiti_WapitiJNI_opt_1s_1prec_1set(JNIEnv *jenv, jclass jcls, jlong jarg1, jobject jarg1_, jint jarg2) {
  opt_s *arg1 = (opt_s *) 0 ;
  int arg2 ;
  
  (void)jenv;
  (void)jcls;
  (void)jarg1_;
  arg1 = *(opt_s **)&jarg1; 
  arg2 = (int)jarg2; 
  if (arg1) (arg1)->prec = arg2;
}